

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O2

void project_monster_handler_MON_CLONE(project_monster_handler_context_t *context)

{
  monster *mon;
  _Bool _Var1;
  
  mon = context->mon;
  mon->hp = mon->maxhp;
  mon_inc_timed(mon,L'\x05',L'2',L'\x01');
  _Var1 = multiply_monster(context->mon);
  if ((_Var1) && (context->seen == true)) {
    context->hurt_msg = MON_MSG_SPAWN;
  }
  context->dam = L'\0';
  return;
}

Assistant:

static void project_monster_handler_MON_CLONE(project_monster_handler_context_t *context)
{
	/* Heal fully */
	context->mon->hp = context->mon->maxhp;

	/* Speed up */
	mon_inc_timed(context->mon, MON_TMD_FAST, 50, MON_TMD_FLG_NOTIFY);

	/* Attempt to clone. */
	if (multiply_monster(context->mon) && context->seen)
		context->hurt_msg = MON_MSG_SPAWN;

	/* No "real" damage */
	context->dam = 0;

}